

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall ON_SubDEdge::OtherEndVertex(ON_SubDEdge *this,ON_SubDVertex *vertex)

{
  ON_SubDVertex *vertex_local;
  ON_SubDEdge *this_local;
  
  if (vertex != (ON_SubDVertex *)0x0) {
    if (this->m_vertex[0] == vertex) {
      if (this->m_vertex[1] != vertex) {
        return this->m_vertex[1];
      }
    }
    else if (this->m_vertex[1] == vertex) {
      return this->m_vertex[0];
    }
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubDEdge::OtherEndVertex(
  const ON_SubDVertex* vertex
  ) const
{
  if (nullptr != vertex)
  {
    if (m_vertex[0] == vertex)
    {
      if (m_vertex[1] != vertex )
        return m_vertex[1];
    }
    else if (m_vertex[1] == vertex )
      return m_vertex[0];
  }
  return nullptr;
}